

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManConstructFromMap
              (Gia_Man_t *pNew,Vec_Int_t *vGates,int nVars,Vec_Int_t *vUsed,Vec_Int_t *vCopy,
              int fHash)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  
  iVar1 = Vec_IntEntryLast(vGates);
  if (vUsed->nSize != nVars) {
    __assert_fail("Vec_IntSize(vUsed) == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x20f,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (vGates->nSize < 2) {
    __assert_fail("Vec_IntSize(vGates) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x210,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if ((vGates->nSize & 1U) == 0) {
    __assert_fail("Vec_IntSize(vGates) % 2 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x211,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  iVar1 = Abc_Lit2Var(iVar1);
  if (iVar1 - nVars != vGates->nSize / 2 + -1) {
    __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x212,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vCopy->nSize = 0;
  iVar1 = 1;
  do {
    if (vGates->nSize <= iVar1) {
      if (vCopy->nSize != vGates->nSize / 2) {
        __assert_fail("Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x22d,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar1 = Vec_IntEntry(vCopy,vCopy->nSize + -1);
      return iVar1;
    }
    iVar2 = Vec_IntEntry(vGates,iVar1 + -1);
    iVar3 = Vec_IntEntry(vGates,iVar1);
    uVar4 = Abc_Lit2Var(iVar2);
    uVar5 = Abc_Lit2Var(iVar3);
    uVar9 = uVar4 - nVars;
    pVVar10 = vCopy;
    if ((int)uVar4 < nVars) {
      pVVar10 = vUsed;
      uVar9 = uVar4;
    }
    iVar6 = Vec_IntEntry(pVVar10,uVar9);
    uVar9 = uVar5 - nVars;
    pVVar10 = vCopy;
    if ((int)uVar5 < nVars) {
      pVVar10 = vUsed;
      uVar9 = uVar5;
    }
    iVar7 = Vec_IntEntry(pVVar10,uVar9);
    if (uVar4 < uVar5) {
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_LitNotCond(iVar6,iVar2);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar3 = Abc_LitNotCond(iVar7,iVar3);
      if (fHash == 0) {
        iVar2 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
      }
      else {
        iVar2 = Gia_ManHashAnd(pNew,iVar2,iVar3);
      }
    }
    else {
      if (uVar4 <= uVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x22a,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar8 = Abc_LitIsCompl(iVar2);
      if (iVar8 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x223,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar8 = Abc_LitIsCompl(iVar3);
      if (iVar8 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x224,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_LitNotCond(iVar6,iVar2);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar3 = Abc_LitNotCond(iVar7,iVar3);
      if (fHash == 0) {
        iVar6 = Abc_LitNot(iVar3);
        iVar7 = Abc_LitNot(iVar2);
        iVar3 = Gia_ManAppendAnd(pNew,iVar7,iVar3);
        iVar2 = Gia_ManAppendAnd(pNew,iVar2,iVar6);
        iVar3 = Abc_LitNot(iVar3);
        iVar2 = Abc_LitNot(iVar2);
        iVar2 = Gia_ManAppendAnd(pNew,iVar3,iVar2);
        iVar2 = Abc_LitNotCond(iVar2,1);
      }
      else {
        iVar2 = Gia_ManHashXor(pNew,iVar2,iVar3);
      }
    }
    Vec_IntPush(vCopy,iVar2);
    iVar1 = iVar1 + 2;
  } while( true );
}

Assistant:

int Gia_ManConstructFromMap( Gia_Man_t * pNew, Vec_Int_t * vGates, int nVars, Vec_Int_t * vUsed, Vec_Int_t * vCopy, int fHash )
{
    int i, iLit0, iLit1, iLitRes, iTopLit = Vec_IntEntryLast( vGates );
    assert( Vec_IntSize(vUsed) == nVars );
    assert( Vec_IntSize(vGates) > 1 );
    assert( Vec_IntSize(vGates) % 2 == 1 );
    assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1 );
    Vec_IntClear( vCopy );
    Vec_IntForEachEntryDouble( vGates, iLit0, iLit1, i )
    {
        int iVar0 = Abc_Lit2Var(iLit0);
        int iVar1 = Abc_Lit2Var(iLit1);
        int iRes0 = iVar0 < nVars ? Vec_IntEntry(vUsed, iVar0) : Vec_IntEntry(vCopy, iVar0 - nVars);
        int iRes1 = iVar1 < nVars ? Vec_IntEntry(vUsed, iVar1) : Vec_IntEntry(vCopy, iVar1 - nVars);
        if ( iVar0 < iVar1 )
        {
            if ( fHash )
                iLitRes = Gia_ManHashAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else if ( iVar0 > iVar1 )
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLitRes = Gia_ManHashXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else assert( 0 );
        Vec_IntPush( vCopy, iLitRes );
    }
    assert( Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2 );
    iLitRes = Vec_IntEntry( vCopy, Vec_IntSize(vGates)/2-1 );
    return iLitRes;
}